

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnni.cpp
# Opt level: O2

void ncnn::transpose_pack_A_tile_int8_avxvnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  long lVar15;
  void *pvVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined1 *puVar29;
  long lVar30;
  int iVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_ZMM4 [64];
  long local_a8;
  long local_a0;
  long local_80;
  
  auVar34 = in_ZMM4._0_16_;
  iVar6 = cpu_support_x86_avx_vnni_int8();
  if (iVar6 != 0) {
    transpose_pack_A_tile_int8_avxvnniint8(A,AT,i,max_ii,k,max_kk);
    return;
  }
  iVar6 = A->w;
  lVar8 = (long)iVar6;
  pauVar11 = (undefined1 (*) [16])AT->data;
  lVar12 = (long)k;
  lVar19 = (long)(iVar6 * 2);
  lVar9 = (long)(iVar6 * 4);
  local_a0 = (long)i;
  lVar17 = (long)max_ii;
  lVar28 = iVar6 * 3 + local_a0;
  lVar20 = lVar19 + local_a0;
  local_a8 = lVar8 + local_a0;
  lVar26 = (iVar6 * 3 + 1) + local_a0;
  local_80 = (iVar6 + 1) + local_a0;
  lVar27 = (iVar6 + 3) + local_a0;
  lVar10 = (iVar6 + 2) + local_a0;
  uVar25 = 0;
  while( true ) {
    auVar36 = _DAT_00545c90;
    if (lVar17 <= (long)(uVar25 | 7)) {
      auVar32._4_4_ = iVar6;
      auVar32._0_4_ = iVar6;
      auVar32._8_4_ = iVar6;
      auVar32._12_4_ = iVar6;
      vpmulld_avx(auVar32,_DAT_00545850);
      while( true ) {
        if (lVar17 <= (long)(uVar25 | 3)) {
          for (; (long)(uVar25 | 1) < lVar17; uVar25 = uVar25 + 2) {
            pvVar16 = A->data;
            lVar24 = A->w * lVar12 * A->elemsize;
            lVar10 = local_a0 + (long)pvVar16;
            lVar27 = lVar26 + (long)pvVar16;
            lVar23 = (long)pvVar16 + local_80;
            lVar15 = (long)pvVar16 + lVar28;
            lVar13 = lVar20 + (long)pvVar16;
            lVar21 = (long)pvVar16 + local_a8;
            iVar31 = 0;
            iVar6 = 1;
            iVar7 = 0;
            for (iVar18 = 3; iVar18 < max_kk; iVar18 = iVar18 + 4) {
              cVar1 = *(char *)(lVar10 + lVar24);
              (*pauVar11)[0] = cVar1;
              cVar2 = *(char *)(lVar21 + lVar24);
              (*pauVar11)[1] = cVar2;
              cVar3 = *(char *)(lVar13 + lVar24);
              (*pauVar11)[2] = cVar3;
              cVar4 = *(char *)(lVar15 + lVar24);
              (*pauVar11)[3] = cVar4;
              cVar5 = *(char *)(lVar10 + 1 + lVar24);
              (*pauVar11)[4] = cVar5;
              iVar31 = (int)cVar2 + (int)cVar3 + iVar31 + cVar1 + (int)cVar4;
              cVar1 = *(char *)(lVar23 + lVar24);
              (*pauVar11)[5] = cVar1;
              cVar2 = *(char *)(lVar13 + 1 + lVar24);
              (*pauVar11)[6] = cVar2;
              cVar3 = *(char *)(lVar27 + lVar24);
              (*pauVar11)[7] = cVar3;
              iVar7 = (int)cVar1 + (int)cVar2 + iVar7 + cVar5 + (int)cVar3;
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
              lVar10 = lVar10 + lVar9;
              lVar27 = lVar27 + lVar9;
              lVar23 = lVar23 + lVar9;
              lVar15 = lVar15 + lVar9;
              lVar13 = lVar13 + lVar9;
              lVar21 = lVar21 + lVar9;
              iVar6 = iVar6 + 4;
            }
            if (3 < max_kk) {
              *(int *)*pauVar11 = iVar31 * 0x7f;
              *(int *)(*pauVar11 + 4) = iVar7 * 0x7f;
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
            }
            for (; iVar6 < max_kk; iVar6 = iVar6 + 2) {
              (*pauVar11)[0] = *(undefined1 *)(lVar10 + lVar24);
              (*pauVar11)[1] = *(undefined1 *)(lVar21 + lVar24);
              (*pauVar11)[2] = *(undefined1 *)(lVar10 + 1 + lVar24);
              (*pauVar11)[3] = *(undefined1 *)(lVar23 + lVar24);
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
              lVar10 = lVar10 + lVar19;
              lVar23 = lVar23 + lVar19;
              lVar21 = lVar21 + lVar19;
            }
            for (iVar6 = iVar6 + -1; iVar6 < max_kk; iVar6 = iVar6 + 1) {
              (*pauVar11)[0] = *(undefined1 *)(lVar10 + lVar24);
              (*pauVar11)[1] = *(undefined1 *)(lVar10 + 1 + lVar24);
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 2);
              lVar24 = lVar24 + lVar8;
            }
            local_a0 = local_a0 + 2;
            lVar28 = lVar28 + 2;
            lVar20 = lVar20 + 2;
            local_a8 = local_a8 + 2;
            lVar26 = lVar26 + 2;
            local_80 = local_80 + 2;
          }
          for (; (long)uVar25 < lVar17; uVar25 = uVar25 + 1) {
            pvVar16 = (void *)(A->w * lVar12 * A->elemsize + (long)A->data);
            iVar6 = 0;
            for (uVar22 = 0; (int)uVar22 + 3 < max_kk; uVar22 = uVar22 + 4) {
              cVar1 = *(char *)((long)pvVar16 + local_a0);
              (*pauVar11)[uVar22] = cVar1;
              cVar2 = *(char *)((long)pvVar16 + local_a8);
              (*pauVar11)[uVar22 + 1] = cVar2;
              cVar3 = *(char *)((long)pvVar16 + lVar20);
              (*pauVar11)[uVar22 + 2] = cVar3;
              cVar4 = *(char *)((long)pvVar16 + lVar28);
              (*pauVar11)[uVar22 + 3] = cVar4;
              iVar6 = (int)cVar2 + (int)cVar3 + iVar6 + cVar1 + (int)cVar4;
              pvVar16 = (void *)((long)pvVar16 + lVar9);
            }
            if (max_kk < 4) {
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + uVar22);
            }
            else {
              puVar29 = *pauVar11;
              pauVar11 = (undefined1 (*) [16])((long)(puVar29 + uVar22) + 4);
              *(int *)(puVar29 + uVar22) = iVar6 * 0x7f;
            }
            puVar29 = (undefined1 *)((long)pvVar16 + local_a0);
            for (; (int)uVar22 < max_kk; uVar22 = (ulong)((int)uVar22 + 1)) {
              (*pauVar11)[0] = *puVar29;
              pauVar11 = (undefined1 (*) [16])(*pauVar11 + 1);
              puVar29 = puVar29 + lVar8;
            }
            local_a0 = local_a0 + 1;
            lVar28 = lVar28 + 1;
            lVar20 = lVar20 + 1;
            local_a8 = local_a8 + 1;
          }
          return;
        }
        lVar30 = A->w * lVar12 * A->elemsize;
        pvVar16 = A->data;
        lVar13 = (long)pvVar16 + local_a0;
        lVar23 = (long)pvVar16 + lVar27;
        lVar24 = (long)pvVar16 + lVar10;
        lVar21 = (long)pvVar16 + local_80;
        lVar15 = (long)pvVar16 + local_a8;
        iVar6 = 1;
        if (3 < max_kk) break;
        if (3 < max_kk) {
          *pauVar11 = (undefined1  [16])0x0;
          pauVar11 = pauVar11 + 1;
        }
        for (; iVar6 < max_kk; iVar6 = iVar6 + 2) {
          (*pauVar11)[0] = *(undefined1 *)(lVar13 + lVar30);
          (*pauVar11)[1] = *(undefined1 *)(lVar15 + lVar30);
          (*pauVar11)[2] = *(undefined1 *)(lVar13 + 1 + lVar30);
          (*pauVar11)[3] = *(undefined1 *)(lVar21 + lVar30);
          (*pauVar11)[4] = *(undefined1 *)(lVar13 + 2 + lVar30);
          (*pauVar11)[5] = *(undefined1 *)(lVar24 + lVar30);
          (*pauVar11)[6] = *(undefined1 *)(lVar13 + 3 + lVar30);
          (*pauVar11)[7] = *(undefined1 *)(lVar23 + lVar30);
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
          lVar13 = lVar13 + lVar19;
          lVar23 = lVar23 + lVar19;
          lVar24 = lVar24 + lVar19;
          lVar21 = lVar21 + lVar19;
          lVar15 = lVar15 + lVar19;
        }
        puVar29 = (undefined1 *)(lVar13 + lVar30);
        for (iVar6 = iVar6 + -1; iVar6 < max_kk; iVar6 = iVar6 + 1) {
          (*pauVar11)[0] = *puVar29;
          (*pauVar11)[1] = puVar29[1];
          (*pauVar11)[2] = puVar29[2];
          (*pauVar11)[3] = puVar29[3];
          pauVar11 = (undefined1 (*) [16])(*pauVar11 + 4);
          puVar29 = puVar29 + lVar8;
        }
        uVar25 = uVar25 + 4;
        local_a0 = local_a0 + 4;
        lVar28 = lVar28 + 4;
        lVar20 = lVar20 + 4;
        local_a8 = local_a8 + 4;
        lVar26 = lVar26 + 4;
        local_80 = local_80 + 4;
        lVar27 = lVar27 + 4;
        lVar10 = lVar10 + 4;
      }
      auVar34 = vpcmpeqd_avx(auVar34,auVar34);
      auVar34 = vpgatherdd((undefined1  [16])0x0,auVar34);
      vpshufb_avx(auVar34,auVar36);
      halt_baddata();
    }
    pvVar16 = A->data;
    lVar23 = A->w * lVar12 * A->elemsize;
    lVar13 = (long)pvVar16 + local_a0;
    lVar24 = (long)pvVar16 + local_a8;
    iVar18 = 0;
    if (3 < max_kk) break;
    if (3 < max_kk) {
      *(undefined8 *)*pauVar11 = 0;
      *(undefined8 *)(*pauVar11 + 8) = 0;
      *(undefined8 *)pauVar11[1] = 0;
      *(undefined8 *)(pauVar11[1] + 8) = 0;
      pauVar11 = pauVar11 + 2;
    }
    for (; iVar18 + 1 < max_kk; iVar18 = iVar18 + 2) {
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(lVar13 + lVar23);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(lVar24 + lVar23);
      auVar36 = vpunpcklbw_avx(auVar33,auVar35);
      *pauVar11 = auVar36;
      pauVar11 = pauVar11 + 1;
      lVar13 = lVar13 + lVar19;
      lVar24 = lVar24 + lVar19;
    }
    puVar14 = (undefined8 *)(lVar13 + lVar23);
    for (; iVar18 < max_kk; iVar18 = iVar18 + 1) {
      *(undefined8 *)*pauVar11 = *puVar14;
      pauVar11 = (undefined1 (*) [16])(*pauVar11 + 8);
      puVar14 = (undefined8 *)((long)puVar14 + lVar8);
    }
    uVar25 = uVar25 + 8;
    local_a0 = local_a0 + 8;
    lVar28 = lVar28 + 8;
    lVar20 = lVar20 + 8;
    local_a8 = local_a8 + 8;
    lVar26 = lVar26 + 8;
    local_80 = local_80 + 8;
    lVar27 = lVar27 + 8;
    lVar10 = lVar10 + 8;
  }
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(lVar13 + lVar23);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(lVar24 + lVar23);
  auVar34 = vpunpcklbw_avx(auVar34,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)((long)pvVar16 + lVar23 + lVar20);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)((long)pvVar16 + lVar23 + lVar28);
  auVar36 = vpunpcklbw_avx(auVar37,auVar38);
  vpunpcklwd_avx(auVar34,auVar36);
  vpunpckhwd_avx(auVar34,auVar36);
  halt_baddata();
}

Assistant:

void transpose_pack_A_tile_int8_avxvnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}